

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O3

void * generateMAC(void *parameters)

{
  undefined8 *puVar1;
  long *plVar2;
  size_t sVar3;
  long lVar4;
  _Bool _Var5;
  int iVar6;
  chunk *pcVar7;
  chunk *pcVar8;
  undefined8 *puVar9;
  uint64_t *hash;
  long lVar10;
  bool bVar11;
  
  sVar3 = *(size_t *)(*(long *)((long)parameters + 0x20) + 0x1c0);
  puVar1 = (undefined8 *)((long)parameters + 0x30);
  pcVar8 = (chunk *)0x0;
  bVar11 = false;
  lVar4 = 0;
  do {
    lVar10 = lVar4;
    pcVar7 = front(*(queue **)((long)parameters + 0x38));
    if ((pcVar7 != (chunk *)0x0) &&
       (pcVar7 = front(*(queue **)((long)parameters + 0x38)), pcVar7->action == '\x05')) {
      pcVar8 = front(*(queue **)((long)parameters + 0x38));
      if ((pcVar8 == (chunk *)0x0) ||
         (pcVar8 = front(*(queue **)((long)parameters + 0x38)), pcVar8->action != '\x05')) {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffff5;
      }
      else {
        lVar4 = *(long *)((long)parameters + 0x20);
        hash = (uint64_t *)calloc(*(size_t *)(lVar4 + 0x1c0),1);
        skeinFinal(*(SkeinCtx_t **)(lVar4 + 0x1a8),(uint8_t *)hash);
        pcVar8 = createChunk();
        pcVar8->action = '\x06';
        pcVar8->data = hash;
        pcVar8->data_size = sVar3;
        _Var5 = queueIsFull(*(queue **)((long)parameters + 0x40));
        if (_Var5) {
          do {
            nanosleep((timespec *)&wait_interval,(timespec *)0x0);
            _Var5 = queueIsFull(*(queue **)((long)parameters + 0x40));
          } while (_Var5);
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
        _Var5 = enque(pcVar8,*(queue **)((long)parameters + 0x40));
        if ((!_Var5) &&
           (**(undefined4 **)((long)parameters + 0x18) = 0xfffffff5, hash != (uint64_t *)0x0)) {
          free(hash);
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
        iVar6 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
        ;
        if (iVar6 == 0) {
          lVar4 = *(long *)((long)parameters + 0x48);
          plVar2 = (long *)(lVar4 + 0x18);
          *plVar2 = *plVar2 + sVar3;
          pthread_mutex_unlock(*(pthread_mutex_t **)(lVar4 + 8));
        }
        _Var5 = queueIsFull(*(queue **)((long)parameters + 0x40));
        if (_Var5) {
          do {
            nanosleep((timespec *)&wait_interval,(timespec *)0x0);
            _Var5 = queueIsFull(*(queue **)((long)parameters + 0x40));
          } while (_Var5);
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
        _Var5 = queueDone(*(queue **)((long)parameters + 0x40));
        if (_Var5) {
          pthread_mutex_unlock((pthread_mutex_t *)*puVar1);
        }
        else {
          **(undefined4 **)((long)parameters + 0x18) = 0xfffffff1;
        }
      }
      return (void *)0x0;
    }
    if (pcVar8 == (chunk *)0x0) {
      pcVar8 = front(*(queue **)((long)parameters + 0x38));
      if (pcVar8 != (chunk *)0x0) {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
        pcVar8 = front(*(queue **)((long)parameters + 0x38));
        if (pcVar8 != (chunk *)0x0) {
          deque(*(queue **)((long)parameters + 0x38));
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
          bVar11 = false;
          goto LAB_001057c2;
        }
        bVar11 = false;
        puVar9 = (undefined8 *)((long)parameters + 0x28);
        pcVar7 = (chunk *)0x0;
        goto LAB_00105898;
      }
      pcVar8 = (chunk *)0x0;
    }
    else {
LAB_001057c2:
      if ((pcVar8->action != '\x04') || (bVar11)) {
        if (!bVar11) goto LAB_001058ab;
      }
      else {
        skeinUpdate(*(SkeinCtx_t **)(*(long *)((long)parameters + 0x20) + 0x1a8),
                    (uint8_t *)pcVar8->data,pcVar8->data_size);
        pcVar8->action = *(uint8_t *)(*(long *)((long)parameters + 0x20) + 0x1b0);
        lVar10 = lVar10 + pcVar8->data_size;
        bVar11 = true;
      }
      while (_Var5 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var5) {
        nanosleep((timespec *)&wait_interval,(timespec *)0x0);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
      _Var5 = enque(pcVar8,*(queue **)((long)parameters + 0x40));
      puVar9 = puVar1;
      pcVar7 = (chunk *)0x0;
      if (!_Var5) {
        pcVar7 = pcVar8;
      }
LAB_00105898:
      pcVar8 = pcVar7;
      pthread_mutex_unlock((pthread_mutex_t *)*puVar9);
    }
LAB_001058ab:
    lVar4 = 0;
    if ((lVar10 != 0) &&
       (iVar6 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
       , lVar4 = lVar10, iVar6 == 0)) {
      lVar4 = *(long *)((long)parameters + 0x48);
      plVar2 = (long *)(lVar4 + 0x18);
      *plVar2 = *plVar2 + lVar10;
      pthread_mutex_unlock(*(pthread_mutex_t **)(lVar4 + 8));
      lVar4 = 0;
    }
  } while( true );
}

Assistant:

void* generateMAC(void* parameters)
{
    pdebug("generateMAC()\n");

    bool chunk_maced = false;
    chunk* update_chunk = NULL;
    macParams* params = parameters;
    const uint64_t mac_size = (uint64_t)params->mac_context->digest_byte_size;
    uint64_t mac_progress = 0;
    
    //iterate through the queue until the DONE flag is received and update the SkeinMAC with everything in it
    while (front(params->in) == NULL || front(params->in)->action != DONE)
    {
        //attempt to get the front chunk in the queue
        if(update_chunk == NULL && front(params->in) != NULL) 
        {
             pthread_mutex_lock(params->in_mutex);
             update_chunk = front(params->in);
             if (update_chunk != NULL) { deque(params->in); }
             pthread_mutex_unlock(params->in_mutex);
             chunk_maced = false;
        }
        
        //generate the MAC from the chunk
        if (update_chunk != NULL && update_chunk->action == GEN_MAC && !chunk_maced)
        {
             pdebug("*** Updating MAC on chunk of size %lu ***\n",
                    update_chunk->data_size);

             //update the MAC with the current chunk
             skeinUpdate(params->mac_context->skein_context_ptr,
                         (const uint8_t*)update_chunk->data,
                         update_chunk->data_size);

             //change the action and status
             update_chunk->action = params->mac_context->out_action;
             mac_progress += update_chunk->data_size; //update the progress bar
             chunk_maced = true;
        }
        
        //attempt to queue the chunk
        if (update_chunk != NULL && chunk_maced)
        {
            pdebug("*** Queuing data chunk to write que of size %lu ***\n",
                   update_chunk->data_size);

            while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //spin until queue is empty
            pthread_mutex_lock(params->out_mutex);
            if (enque(update_chunk, params->out)) { update_chunk = NULL; }
            pthread_mutex_unlock(params->out_mutex);
            //on a successfull queue set mac chunk to NULL so the next chunk will be MACed
        } //end queue operation

	    if (mac_progress > 0)
        {
	        if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += mac_progress;
		        mac_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }
        //otherwise spin and wait for the queue to empty
    } //end thread loop

    if (front(params->in) != NULL && front(params->in)->action == DONE)//if we have reached the end of the in queue then get the MAC and que it to the out que 
    {
        uint64_t* mac = calloc(params->mac_context->digest_byte_size,
                               sizeof(uint8_t));

        skeinFinal(params->mac_context->skein_context_ptr, (uint8_t*)mac);
        chunk* mac_chunk = createChunk();
        mac_chunk->action = MAC;
        mac_chunk->data = mac;
        mac_chunk->data_size = mac_size;

        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //wait for the queue to be not be full
        pthread_mutex_lock(params->out_mutex);
        if (!enque(mac_chunk, params->out)) //que the mac chunk 
        {
            *(params->error) = MAC_GENERATION_FAIL; //mac failed to enque
            if (mac != NULL) { free(mac); }
        }
        pthread_mutex_unlock(params->out_mutex);
        pdebug("*** Queuing MAC chunk to write que of size %lu ***\n", mac_size);

        //update the progress bar
	    if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	    {
	        params->progress->progress += mac_size;
            mac_progress = 0;
            pthread_mutex_unlock(params->progress->progress_mutex);
	    }

        //queue Done flag
        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); }
        pthread_mutex_lock(params->out_mutex);
        if (!queueDone(params->out))
        {
            pdebug("Error queueing done\n");
            *(params->error) = QUEUE_OPERATION_FAIL;

            return NULL;
        }

        pthread_mutex_unlock(params->out_mutex);
        pdebug("*** Done queued *** \n");
    }
    else //something went wrong
    {
        *(params->error) = MAC_GENERATION_FAIL;

        return NULL;
    }
    
    return NULL;
}